

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O0

void __thiscall QPainter::translate(QPainter *this,QPointF *offset)

{
  bool bVar1;
  QPainterPrivate *pQVar2;
  pointer pQVar3;
  QPointF *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  QMessageLogger *this_00;
  QPainterPrivate *this_01;
  QPainterPrivate *d;
  qreal dy;
  qreal dx;
  char local_28 [32];
  long local_8;
  int line;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QMessageLogger *)QPointF::x(in_RSI);
  this_01 = (QPainterPrivate *)QPointF::y(in_RSI);
  pQVar2 = d_func((QPainter *)0x597212);
  line = (int)((ulong)pQVar2 >> 0x20);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor> *)0x597228);
  if (bVar1) {
    std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
              ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x597262);
    QTransform::translate((QTransform *)in_RSI,(qreal)this_00,(qreal)this_01);
    pQVar3 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                       ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x59728b);
    pQVar3->field_0x1a0 = pQVar3->field_0x1a0 & 0xfe | 1;
    QPainterPrivate::updateMatrix(this_01);
  }
  else {
    QMessageLogger::QMessageLogger(this_00,(char *)this_01,line,in_RDI);
    QMessageLogger::warning(local_28,"QPainter::translate: Painter not active");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPainter::translate(const QPointF &offset)
{
    qreal dx = offset.x();
    qreal dy = offset.y();
#ifdef QT_DEBUG_DRAW
    if (qt_show_painter_debug_output)
        printf("QPainter::translate(), dx=%f, dy=%f\n", dx, dy);
#endif
    Q_D(QPainter);
    if (!d->engine) {
        qWarning("QPainter::translate: Painter not active");
        return;
    }

    d->state->worldMatrix.translate(dx, dy);
    d->state->WxF = true;
    d->updateMatrix();
}